

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# yacclab_tests.cc
# Opt level: O0

bool __thiscall
YacclabTests::CheckFileList
          (YacclabTests *this,path *base_path,
          vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool>_>_>
          *filenames)

{
  error_category *peVar1;
  bool bVar2;
  error_category *peVar3;
  reference pvVar4;
  path local_80;
  path local_60;
  undefined1 local_40 [8];
  error_code ec;
  size_t i;
  bool ret;
  vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool>_>_>
  *filenames_local;
  path *base_path_local;
  YacclabTests *this_local;
  
  i._7_1_ = true;
  ec._M_cat = (error_category *)0x0;
  while( true ) {
    peVar1 = ec._M_cat;
    peVar3 = (error_category *)
             std::
             vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool>_>_>
             ::size(filenames);
    if (peVar3 <= peVar1) break;
    std::error_code::error_code((error_code *)local_40);
    pvVar4 = std::
             vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool>_>_>
             ::operator[](filenames,(size_type)ec._M_cat);
    filesystem::path::path(&local_80,&pvVar4->first);
    filesystem::operator/(&local_60,base_path,&local_80);
    bVar2 = filesystem::exists(&local_60,(error_code *)local_40);
    pvVar4 = std::
             vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool>_>_>
             ::operator[](filenames,(size_type)ec._M_cat);
    pvVar4->second = bVar2;
    filesystem::path::~path(&local_60);
    filesystem::path::~path(&local_80);
    pvVar4 = std::
             vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool>_>_>
             ::operator[](filenames,(size_type)ec._M_cat);
    if ((pvVar4->second & 1U) == 0) {
      i._7_1_ = false;
    }
    ec._M_cat = ec._M_cat + 1;
  }
  return i._7_1_;
}

Assistant:

bool YacclabTests::CheckFileList(const path& base_path, std::vector<std::pair<std::string, bool>>& filenames)
{
    bool ret = true;
    for (size_t i = 0; i < filenames.size(); ++i) {
        std::error_code ec;
        filenames[i].second = filesystem::exists(base_path / path(filenames[i].first), ec);
        if (!filenames[i].second) {
            ret = false;
        }
    }
    return ret;
}